

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_interpolate.cpp
# Opt level: O1

void __thiscall
DSectorPlaneInterpolation::DSectorPlaneInterpolation
          (DSectorPlaneInterpolation *this,sector_t *_sector,bool _plane,bool attach)

{
  secplane_t *psVar1;
  splane *psVar2;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  bool bVar3;
  
  DObject::DObject((DObject *)this);
  (this->super_DInterpolation).Next.field_0.p = (DInterpolation *)0x0;
  (this->super_DInterpolation).Prev.field_0.p = (DInterpolation *)0x0;
  (this->super_DInterpolation).refcount = 0;
  (this->super_DInterpolation).super_DObject._vptr_DObject = (_func_int **)&PTR_StaticType_00869390;
  (this->attached).Array = (DInterpolation **)0x0;
  (this->attached).Most = 0;
  (this->attached).Count = 0;
  this->sector = _sector;
  this->ceiling = _plane;
  bVar3 = (int)CONCAT71(in_register_00000011,_plane) != 0;
  psVar1 = &_sector->floorplane;
  if (bVar3) {
    psVar1 = &_sector->ceilingplane;
  }
  psVar2 = _sector->planes + 1;
  if (!bVar3) {
    psVar2 = _sector->planes;
  }
  this->oldheight = psVar1->D;
  this->oldtexz = psVar2->TexZ;
  if ((int)CONCAT71(in_register_00000009,attach) != 0) {
    P_Start3dMidtexInterpolations(&this->attached,_sector,_plane);
    P_StartLinkedSectorInterpolations(&this->attached,this->sector,this->ceiling);
  }
  FInterpolator::AddInterpolation(&interpolator,&this->super_DInterpolation);
  return;
}

Assistant:

DSectorPlaneInterpolation::DSectorPlaneInterpolation(sector_t *_sector, bool _plane, bool attach)
{
	sector = _sector;
	ceiling = _plane;
	UpdateInterpolation ();

	if (attach)
	{
		P_Start3dMidtexInterpolations(attached, sector, ceiling);
		P_StartLinkedSectorInterpolations(attached, sector, ceiling);
	}
	interpolator.AddInterpolation(this);
}